

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi__context *s;
  byte bVar1;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc *psVar7;
  byte *pbVar8;
  void *pvVar9;
  int iVar10;
  char *pcVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar12;
  uint uVar13;
  int iVar14;
  int b;
  int a;
  int *piVar15;
  ulong uVar16;
  long *in_FS_OFFSET;
  long local_60;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0xb) {
LAB_001651ec:
    lVar12 = *in_FS_OFFSET;
    pcVar11 = "bad SOF len";
  }
  else {
    psVar7 = s->img_buffer;
    if (psVar7 < s->img_buffer_end) {
LAB_0016522d:
      s->img_buffer = psVar7 + 1;
      if (*psVar7 == '\b') {
        sVar3 = stbi__get16be(s);
        s->img_y = sVar3;
        if (sVar3 == 0) {
          lVar12 = *in_FS_OFFSET;
          pcVar11 = "no header height";
          goto LAB_001652b8;
        }
        sVar3 = stbi__get16be(s);
        s->img_x = sVar3;
        if (sVar3 == 0) {
          lVar12 = *in_FS_OFFSET;
          pcVar11 = "0 width";
          goto LAB_001652b8;
        }
        if (0x1000000 < s->img_y) {
          lVar12 = *in_FS_OFFSET;
          pcVar11 = "too large";
          goto LAB_001652b8;
        }
        pbVar8 = s->img_buffer;
        if (pbVar8 < s->img_buffer_end) {
LAB_001652fe:
          s->img_buffer = pbVar8 + 1;
          bVar1 = *pbVar8;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar8 = s->img_buffer;
            goto LAB_001652fe;
          }
          bVar1 = 0;
        }
        if ((4 < bVar1) || ((0x1aU >> (bVar1 & 0x1f) & 1) == 0)) {
          lVar12 = *in_FS_OFFSET;
          pcVar11 = "bad component count";
          goto LAB_001652b8;
        }
        s->img_n = (uint)bVar1;
        if (bVar1 != 0) {
          lVar12 = 0;
          do {
            *(undefined8 *)((long)&z->img_comp[0].data + lVar12) = 0;
            *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar12) = 0;
            lVar12 = lVar12 + 0x60;
          } while ((ulong)bVar1 * 0x60 != lVar12);
        }
        if (uVar2 == s->img_n * 3 + 8U) {
          z->rgb = 0;
          uVar16 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            piVar15 = &z->img_comp[0].tq;
            lVar12 = 0;
            do {
              pbVar8 = s->img_buffer;
              if (pbVar8 < s->img_buffer_end) {
LAB_001653ae:
                s->img_buffer = pbVar8 + 1;
                bVar1 = *pbVar8;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar8 = s->img_buffer;
                  goto LAB_001653ae;
                }
                bVar1 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar1;
              if ((s->img_n == 3) && (bVar1 == "RGB"[lVar12])) {
                z->rgb = z->rgb + 1;
              }
              pbVar8 = s->img_buffer;
              if (pbVar8 < s->img_buffer_end) {
LAB_00165408:
                s->img_buffer = pbVar8 + 1;
                bVar1 = *pbVar8;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar8 = s->img_buffer;
                  goto LAB_00165408;
                }
                bVar1 = 0;
              }
              piVar15[-2] = (uint)(bVar1 >> 4);
              if ((byte)(bVar1 + 0xb0) < 0xc0) goto LAB_00165738;
              piVar15[-1] = bVar1 & 0xf;
              if ((bVar1 & 0xf) - 5 < 0xfffffffc) goto LAB_00165750;
              pbVar8 = s->img_buffer;
              if (pbVar8 < s->img_buffer_end) {
LAB_00165468:
                s->img_buffer = pbVar8 + 1;
                bVar1 = *pbVar8;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar8 = s->img_buffer;
                  goto LAB_00165468;
                }
                bVar1 = 0;
              }
              *piVar15 = (uint)bVar1;
              if (3 < bVar1) {
                lVar12 = *in_FS_OFFSET;
                pcVar11 = "bad TQ";
                goto LAB_001652b8;
              }
              lVar12 = lVar12 + 1;
              uVar16 = (ulong)s->img_n;
              piVar15 = piVar15 + 0x18;
            } while (lVar12 < (long)uVar16);
          }
          if (scan != 0) {
            return 1;
          }
          iVar10 = (int)uVar16;
          iVar4 = stbi__mad3sizes_valid(s->img_x,s->img_y,iVar10,0);
          if (iVar4 == 0) {
            *(char **)(*in_FS_OFFSET + -0x20) = "too large";
            return 0;
          }
          if (iVar10 < 1) {
            uVar2 = 1;
            uVar13 = 1;
          }
          else {
            uVar13 = 1;
            lVar12 = 0;
            uVar2 = 1;
            do {
              uVar5 = *(uint *)((long)&z->img_comp[0].h + lVar12);
              uVar6 = *(uint *)((long)&z->img_comp[0].v + lVar12);
              if ((int)uVar2 < (int)uVar5) {
                uVar2 = uVar5;
              }
              if ((int)uVar13 < (int)uVar6) {
                uVar13 = uVar6;
              }
              lVar12 = lVar12 + 0x60;
            } while ((uVar16 & 0xffffffff) * 0x60 != lVar12);
          }
          if (0 < iVar10) {
            lVar12 = 0;
            do {
              if ((int)uVar2 % *(int *)((long)&z->img_comp[0].h + lVar12) != 0) goto LAB_00165738;
              if ((int)uVar13 % *(int *)((long)&z->img_comp[0].v + lVar12) != 0) goto LAB_00165750;
              lVar12 = lVar12 + 0x60;
            } while ((uVar16 & 0xffffffff) * 0x60 != lVar12);
          }
          z->img_h_max = uVar2;
          z->img_v_max = uVar13;
          z->img_mcu_w = uVar2 * 8;
          z->img_mcu_h = uVar13 * 8;
          uVar5 = ((s->img_x + uVar2 * 8) - 1) / (uVar2 * 8);
          z->img_mcu_x = uVar5;
          uVar6 = ((s->img_y + uVar13 * 8) - 1) / (uVar13 * 8);
          z->img_mcu_y = uVar6;
          if (s->img_n < 1) {
            return 1;
          }
          piVar15 = &z->img_comp[0].coeff_h;
          local_60 = 0;
          while( true ) {
            piVar15[-0x10] = (s->img_x * piVar15[-0x16] + (uVar2 - 1)) / uVar2;
            piVar15[-0xf] = (s->img_y * piVar15[-0x15] + (uVar13 - 1)) / uVar13;
            iVar10 = piVar15[-0x16] * uVar5;
            a = iVar10 * 8;
            piVar15[-0xe] = a;
            iVar14 = piVar15[-0x15] * uVar6;
            b = iVar14 * 8;
            piVar15[-0xd] = b;
            pvVar9 = stbi__malloc_mad2(a,b,0xf);
            *(void **)(piVar15 + -7) = (void *)0x0;
            *(stbi_uc **)(piVar15 + -5) = (stbi_uc *)0x0;
            *(short **)(piVar15 + -3) = (short *)0x0;
            *(void **)(piVar15 + -9) = pvVar9;
            iVar4 = extraout_EDX;
            if (pvVar9 == (void *)0x0) break;
            *(stbi_uc **)(piVar15 + -0xb) = (stbi_uc *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
            if (z->progressive != 0) {
              piVar15[-1] = iVar10;
              *piVar15 = iVar14;
              pvVar9 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)(piVar15 + -7) = pvVar9;
              iVar4 = extraout_EDX_00;
              if (pvVar9 == (void *)0x0) break;
              *(short **)(piVar15 + -3) = (short *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
            }
            local_60 = local_60 + 1;
            piVar15 = piVar15 + 0x18;
            if (s->img_n <= local_60) {
              return 1;
            }
          }
          *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
          stbi__free_jpeg_components(z,(int)local_60 + 1,iVar4);
          return 0;
        }
        goto LAB_001651ec;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar7 = s->img_buffer;
      goto LAB_0016522d;
    }
    lVar12 = *in_FS_OFFSET;
    pcVar11 = "only 8-bit";
  }
  goto LAB_001652b8;
LAB_00165738:
  lVar12 = *in_FS_OFFSET;
  pcVar11 = "bad H";
  goto LAB_001652b8;
LAB_00165750:
  lVar12 = *in_FS_OFFSET;
  pcVar11 = "bad V";
LAB_001652b8:
  *(char **)(lVar12 + -0x20) = pcVar11;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}